

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall TestParser_TestOrExpr_Test::TestBody(TestParser_TestOrExpr_Test *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertHelper local_d8;
  AssertionResult gtest_ar;
  undefined1 local_a0 [32];
  Parser parser;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"a or b",(allocator<char> *)&local_e0);
  Lexer::Lexer((Lexer *)&gtest_ar,(string *)local_a0);
  Parser::Parser(&parser,(Lexer *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_a0);
  Parser::parse((Parser *)local_a0);
  lVar5 = 0;
  lVar4 = __dynamic_cast(local_a0._0_8_,&AST::Stmt::typeinfo,&AST::ExprStmt::typeinfo,0);
  plVar1 = *(long **)(lVar4 + 8);
  *(undefined8 *)(lVar4 + 8) = 0;
  if (plVar1 != (long *)0x0) {
    lVar5 = __dynamic_cast(plVar1,&AST::Expr::typeinfo,&AST::BinaryExpr::typeinfo,0);
  }
  local_e0.ptr_._0_4_ = 6;
  testing::internal::CmpHelperEQ<TokenType,TokenType>
            ((internal *)&gtest_ar,"orExpr->m_op","TokenType::Or",(TokenType *)(lVar5 + 8),
             (TokenType *)&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
               ,0xcc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    plVar2 = *(long **)(lVar5 + 0x10);
    *(undefined8 *)(lVar5 + 0x10) = 0;
    if (plVar2 == (long *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(plVar2,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    plVar3 = *(long **)(lVar5 + 0x18);
    *(undefined8 *)(lVar5 + 0x18) = 0;
    if (plVar3 == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(plVar3,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
              ((internal *)&gtest_ar,"lident->m_identStr","\"a\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar4 + 8),
               (char (*) [2])0x163f99);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                 ,0xd1,pcVar6);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
                ((internal *)&gtest_ar,"rident->m_identStr","\"b\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 8),
                 (char (*) [2])0x16412a);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_e0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                   ,0xd2,pcVar6);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_e0);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))(plVar3);
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))(plVar1);
  }
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  Parser::~Parser(&parser);
  return;
}

Assistant:

TEST(TestParser, TestOrExpr) {
    Parser parser(Lexer("a or b"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(exprStmt->m_expr);
    auto* orExpr = dynamic_cast<AST::BinaryExpr*>(expr.get());
    ASSERT_EQ(orExpr->m_op, TokenType::Or);
    std::unique_ptr<AST::Expr> left = std::move(orExpr->m_left);
    auto* lident = dynamic_cast<AST::Identifier*>(left.get());
    std::unique_ptr<AST::Expr> right = std::move(orExpr->m_right);
    auto* rident = dynamic_cast<AST::Identifier*>(right.get());
    ASSERT_EQ(lident->m_identStr, "a");
    ASSERT_EQ(rident->m_identStr, "b");
}